

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueExtract(defV *data,Time *val)

{
  string_view timeString;
  string_view val_00;
  string_view val_01;
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  longlong timecodeval;
  size_type sVar6;
  TimeRepresentation<count_time<9,_long>_> TVar7;
  complex<double> *this;
  vector<double,_std::allocator<double>_> *this_00;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this_01;
  const_reference this_02;
  NamedPoint *pNVar8;
  size_type sVar9;
  int64_t timecodeval_00;
  int in_EDX;
  TimeRepresentation<count_time<9,_long>_> *in_RSI;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_RDI;
  int64_t intVal;
  NamedPoint *point;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vec_1;
  vector<double,_std::allocator<double>_> *vec;
  longlong timeCodeValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  size_t index;
  size_t *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  baseType local_70;
  baseType local_60;
  size_type local_18;
  
  pcVar3 = CLI::std::
           variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
           ::index(in_RDI,(char *)in_RSI,in_EDX);
  switch(pcVar3) {
  case (char *)0x0:
    std::
    get<double,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2b60f4);
    TimeRepresentation<count_time<9,_long>_>::operator=
              ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff30,
               (double)in_stack_ffffffffffffff28);
    break;
  case (char *)0x1:
  default:
    plVar4 = std::
             get<long,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)0x2b6126);
    TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode(in_RSI,*plVar4);
    break;
  case (char *)0x2:
    pbVar5 = std::
             get<std::__cxx11::string,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)0x2b6145);
    timecodeval = std::__cxx11::stoll(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,0);
    if ((local_18 == 0xffffffffffffffff) ||
       (sVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar5),
       local_18 == sVar6)) {
      TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode(in_RSI,timecodeval);
    }
    else {
      pbVar5 = std::
               get<std::__cxx11::string,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                         ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)0x2b6211);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
      timeString._M_str = (char *)pbVar5;
      timeString._M_len = (size_t)in_stack_ffffffffffffff30;
      TVar7 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                        (timeString);
      in_RSI->internalTimeCode = TVar7.internalTimeCode;
    }
    break;
  case (char *)0x3:
    this = std::
           get<std::complex<double>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                     ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                       *)0x2b627d);
    std::complex<double>::real_abi_cxx11_(this);
    TimeRepresentation<count_time<9,_long>_>::operator=
              ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff30,
               (double)in_stack_ffffffffffffff28);
    break;
  case (char *)0x4:
    this_00 = std::
              get<std::vector<double,std::allocator<double>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                        ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                          *)0x2b62a4);
    bVar1 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffff40);
    if (bVar1) {
      local_60 = 0;
    }
    else {
      std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
      TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff30,
                 (double)in_stack_ffffffffffffff28);
    }
    in_RSI->internalTimeCode = local_60;
    break;
  case (char *)0x5:
    this_01 = std::
              get<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                        ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                          *)0x2b630c);
    bVar1 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::empty
                      ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                       in_stack_ffffffffffffff40);
    if (bVar1) {
      local_70 = 0;
    }
    else {
      this_02 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                operator[](this_01,0);
      std::complex<double>::real_abi_cxx11_(this_02);
      TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff30,
                 (double)in_stack_ffffffffffffff28);
    }
    in_RSI->internalTimeCode = local_70;
    break;
  case (char *)0x6:
    pNVar8 = std::
             get<helics::NamedPoint,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)0x2b636f);
    uVar2 = std::isnan(pNVar8->value);
    if ((uVar2 & 1) == 0) {
      TimeRepresentation<count_time<9,_long>_>::operator=
                ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff30,
                 (double)in_stack_ffffffffffffff28);
    }
    else {
      sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                         (size_type)in_stack_ffffffffffffff40);
      if (sVar9 == 0xffffffffffffffff) {
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
        val_00._M_str = pcVar3;
        val_00._M_len = (size_t)in_stack_ffffffffffffff50;
        timecodeval_00 = getIntFromString(val_00);
        TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode(in_RSI,timecodeval_00);
      }
      else {
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
        val_01._M_str = (char *)in_RDI;
        val_01._M_len = (size_t)in_RSI;
        getDoubleFromString(val_01);
        TimeRepresentation<count_time<9,_long>_>::operator=
                  ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff30,
                   (double)in_stack_ffffffffffffff28);
      }
    }
  }
  return;
}

Assistant:

void valueExtract(const defV& data, Time& val)
{
    switch (data.index()) {
        case double_loc:  // double
            val = std::get<double>(data);
            break;
        case int_loc:  // int64_t
        default:
            val.setBaseTimeCode(std::get<int64_t>(data));
            break;
        case string_loc:  // string
        {
            size_t index;
            const auto& str = std::get<std::string>(data);
            try {
                auto timeCodeValue = std::stoll(str, &index);
                if ((index == std::string::npos) || (index == str.size())) {
                    val.setBaseTimeCode(timeCodeValue);
                } else {
                    val = gmlc::utilities::loadTimeFromString<helics::Time>(
                        std::get<std::string>(data));
                }
            }
            catch (...) {
                val = timeZero;
            }
            break;
        }
        case complex_loc:  // complex
            val = std::get<std::complex<double>>(data).real();
            break;
        case vector_loc:  // vector
        {
            const auto& vec = std::get<std::vector<double>>(data);
            val = (!vec.empty()) ? Time(vec[0]) : timeZero;
            break;
        }
        case complex_vector_loc: {
            const auto& vec = std::get<std::vector<std::complex<double>>>(data);
            val = (!vec.empty()) ? Time(vec[0].real()) : timeZero;
            break;
        }
        case named_point_loc:
            const auto& point = std::get<NamedPoint>(data);
            if (std::isnan(point.value)) {
                if (point.name.find(".[eE") == std::string::npos) {
                    const std::int64_t intVal = getIntFromString(point.name);
                    val.setBaseTimeCode(intVal);
                } else {
                    val = getDoubleFromString(point.name);
                }
            } else {
                val = point.value;
            }
            break;
    }
}